

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool run_container_validate(run_container_t *run,char **reason)

{
  uint uVar1;
  uint uVar2;
  uint32_t end;
  uint32_t start;
  int i;
  uint32_t last_end;
  char **reason_local;
  run_container_t *run_local;
  _Bool local_1;
  
  if (run->n_runs < 0) {
    *reason = "negative run count";
    local_1 = false;
  }
  else if (run->capacity < 0) {
    *reason = "negative run capacity";
    local_1 = false;
  }
  else if (run->capacity < run->n_runs) {
    *reason = "capacity less than run count";
    local_1 = false;
  }
  else if (run->n_runs == 0) {
    *reason = "zero run count";
    local_1 = false;
  }
  else if (run->runs == (rle16_t *)0x0) {
    *reason = "NULL runs";
    local_1 = false;
  }
  else {
    last_end = 0;
    for (i = 0; i < run->n_runs; i = i + 1) {
      uVar1 = (uint)run->runs[i].value;
      uVar2 = uVar1 + run->runs[i].length + 1;
      if (uVar2 <= uVar1) {
        *reason = "run start + length overflow";
        return false;
      }
      if (0x10000 < uVar2) {
        *reason = "run start + length too large";
        return false;
      }
      if (uVar1 < last_end) {
        *reason = "run start less than last end";
        return false;
      }
      if ((uVar1 == last_end) && (last_end != 0)) {
        *reason = "run start equal to last end, should have combined";
        return false;
      }
      last_end = uVar2;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool run_container_validate(const run_container_t *run, const char **reason) {
    if (run->n_runs < 0) {
        *reason = "negative run count";
        return false;
    }
    if (run->capacity < 0) {
        *reason = "negative run capacity";
        return false;
    }
    if (run->capacity < run->n_runs) {
        *reason = "capacity less than run count";
        return false;
    }

    if (run->n_runs == 0) {
        *reason = "zero run count";
        return false;
    }
    if (run->runs == NULL) {
        *reason = "NULL runs";
        return false;
    }

    // Use uint32_t to avoid overflow issues on ranges that contain UINT16_MAX.
    uint32_t last_end = 0;
    for (int i = 0; i < run->n_runs; ++i) {
        uint32_t start = run->runs[i].value;
        uint32_t end = start + run->runs[i].length + 1;
        if (end <= start) {
            *reason = "run start + length overflow";
            return false;
        }
        if (end > (1 << 16)) {
            *reason = "run start + length too large";
            return false;
        }
        if (start < last_end) {
            *reason = "run start less than last end";
            return false;
        }
        if (start == last_end && last_end != 0) {
            *reason = "run start equal to last end, should have combined";
            return false;
        }
        last_end = end;
    }
    return true;
}